

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_short,10u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  short sVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint recent;
  uint uVar11;
  bool bVar12;
  
  iVar4 = 0;
  uVar6 = 0;
  sVar7 = 0;
  bVar12 = false;
  uVar8 = 0;
  do {
    uVar3 = (uVar6 & 0x3ff) * 2;
    uVar1 = (ushort)uVar8 & 0x3ff;
    uVar11 = 0;
    uVar10 = uVar8;
    do {
      if (uVar11 < uVar8) {
        if ((int)uVar10 < 0x200 - bias) {
LAB_00102450:
          uVar2 = (ushort)uVar11;
          uVar9 = uVar2 & 0x400 | uVar1;
          uVar5 = uVar2 & 0x3ff;
          if (uVar5 < uVar1) {
            if ((ushort)(0x200 - bias) <= (ushort)(uVar1 - uVar5)) {
              uVar9 = uVar9 - 0x400;
            }
          }
          else if ((ushort)(bias + 0x200) < (ushort)(uVar5 - uVar1)) {
            uVar9 = uVar9 + 0x400;
          }
          if (uVar9 != (ushort)uVar8) {
            return bVar12;
          }
          if ((bias == 0) &&
             ((ushort)(((uVar3 & 0x400) + sVar7) - ((ushort)uVar10 & 0x3ff)) != uVar2)) {
            return bVar12;
          }
        }
      }
      else if ((int)(iVar4 + uVar11) <= bias + 0x200) goto LAB_00102450;
      uVar11 = uVar11 + 1;
      uVar3 = uVar3 - 2;
      uVar10 = uVar10 - 1;
    } while (uVar11 != 0x800);
    bVar12 = 0x7fe < uVar8;
    uVar8 = uVar8 + 1;
    sVar7 = sVar7 + 1;
    uVar6 = uVar6 + 1;
    iVar4 = iVar4 + -1;
    if (uVar8 == 0x800) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}